

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O1

void __thiscall flow::ConstantPool::dump(ConstantPool *this)

{
  pointer ppVar1;
  pointer pIVar2;
  pointer pvVar3;
  long lVar4;
  pointer pMVar5;
  pointer ppVar6;
  pointer pcVar7;
  Instruction *program;
  flow *this_00;
  pointer puVar8;
  size_t sVar9;
  char *pcVar10;
  ostream *poVar11;
  size_t sVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar13;
  long lVar14;
  pointer ppVar15;
  char *__format;
  _Alloc_hider in_R9;
  long lVar16;
  long lVar17;
  long lVar18;
  string local_80;
  long local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  puts("; Program");
  if ((this->modules_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->modules_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; Modules");
    lVar14 = (long)(this->modules_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->modules_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar14 = lVar14 >> 6;
      lVar16 = 0;
      do {
        ppVar1 = (this->modules_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&(ppVar1->second)._M_string_length + lVar16) == 0) {
          printf(".module \'%s\'\n",
                 *(undefined8 *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar16));
        }
        else {
          printf(".module \'%s\' from \'%s\'\n",
                 *(undefined8 *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar16),
                 *(undefined8 *)((long)&(ppVar1->second)._M_dataplus._M_p + lVar16));
        }
        lVar16 = lVar16 + 0x40;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  if ((this->nativeFunctionSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nativeFunctionSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; External Functions");
    lVar14 = (long)(this->nativeFunctionSignatures_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nativeFunctionSignatures_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        printf(".extern function %3zu = %-20s\n",lVar17,
               *(undefined8 *)
                ((long)&(((this->nativeFunctionSignatures_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar14 >> 5 != lVar17);
    }
  }
  if ((this->nativeHandlerSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nativeHandlerSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; External Handlers");
    lVar14 = (long)(this->nativeHandlerSignatures_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nativeHandlerSignatures_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        printf(".extern handler %4zu = %-20s\n",lVar17,
               *(undefined8 *)
                ((long)&(((this->nativeHandlerSignatures_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar14 >> 5 != lVar17);
    }
  }
  if ((this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; Integer Constants");
    lVar14 = (long)(this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      do {
        printf(".const integer %5zu = %li\n",lVar16,
               (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar14 >> 3 != lVar16);
    }
  }
  if ((this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; String Constants");
    lVar14 = (long)(this->strings_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->strings_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        printf(".const string %6zu = \'%s\'\n",lVar17,
               *(undefined8 *)
                ((long)&(((this->strings_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar14 >> 5 != lVar17);
    }
  }
  if ((this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; IP Constants");
    lVar14 = (long)(this->ipaddrs_).
                   super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ipaddrs_).
                   super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        pIVar2 = (this->ipaddrs_).
                 super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar10 = pIVar2->cstr_ + lVar16;
        if (*pcVar10 == '\0') {
          inet_ntop(*(int *)(pIVar2->cstr_ + lVar16 + -4),pIVar2->cstr_ + lVar16 + -4 + 0x32,pcVar10
                    ,0x2e);
        }
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        sVar9 = strlen(pcVar10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,pcVar10,pIVar2->cstr_ + lVar16 + sVar9);
        printf(".const ipaddr %6zu = %s\n",lVar17,local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x44;
      } while ((lVar14 >> 2) * -0xf0f0f0f0f0f0f0f - lVar17 != 0);
    }
  }
  if ((this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    puts("\n; CIDR Constants");
    lVar14 = (long)(this->cidrs_).
                   super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->cidrs_).
                   super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        util::Cidr::str_abi_cxx11_
                  (&local_80,
                   (Cidr *)((((this->cidrs_).
                              super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>
                              ._M_impl.super__Vector_impl_data._M_start)->ipaddr_).cstr_ +
                           lVar16 + -4));
        printf(".const cidr %8zu = %s\n",lVar17,local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x50;
      } while ((lVar14 >> 4) * -0x3333333333333333 - lVar17 != 0);
    }
  }
  if ((this->regularExpressions_).
      super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->regularExpressions_).
      super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; Regular Expression Constants");
    lVar14 = (long)(this->regularExpressions_).
                   super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->regularExpressions_).
                   super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        pcVar10 = util::RegExp::c_str((RegExp *)
                                      ((long)&(((this->regularExpressions_).
                                                super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->pattern_
                                              )._M_dataplus._M_p + lVar16));
        printf(".const regex %7zu = /%s/\n",lVar17,pcVar10);
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x40;
      } while (lVar14 >> 6 != lVar17);
    }
  }
  if ((this->stringArrays_).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->stringArrays_).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n; Constant String Arrays\n",0x1a);
    lVar14 = (long)(this->stringArrays_).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->stringArrays_).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      local_60 = (lVar14 >> 3) * -0x5555555555555555;
      lVar14 = 0;
      do {
        pvVar3 = (this->stringArrays_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,".const array<string> ",0x15);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             3;
        local_58 = lVar14;
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," = [",4);
        lVar16 = (long)*(pointer *)
                        ((long)&pvVar3[lVar14].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar3[lVar14].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        if (lVar16 != 0) {
          lVar18 = 8;
          lVar17 = 0;
          do {
            if (lVar17 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
            }
            local_80._M_dataplus._M_p._0_1_ = 0x22;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)&local_80,1);
            lVar4 = *(long *)&pvVar3[lVar14].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,*(char **)(lVar4 + -8 + lVar18),*(long *)(lVar4 + lVar18));
            local_80._M_dataplus._M_p._0_1_ = 0x22;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_80,1);
            lVar17 = lVar17 + 1;
            lVar18 = lVar18 + 0x20;
          } while (lVar16 >> 5 != lVar17);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"];\n",3);
        lVar14 = local_58 + 1;
      } while (lVar14 != local_60);
    }
  }
  dumpArrays<long>(&this->intArrays_,"Integer");
  dumpArrays<flow::util::IPAddress>(&this->ipaddrArrays_,"IPAddress");
  dumpArrays<flow::util::Cidr>(&this->cidrArrays_,"Cidr");
  if ((this->matchDefs_).super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (this->matchDefs_).super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    puts("\n; Match Table");
    lVar14 = (long)(this->matchDefs_).
                   super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->matchDefs_).
                   super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      local_60 = (lVar14 >> 4) * -0x5555555555555555;
      lVar14 = 0;
      uVar13 = extraout_RDX;
      do {
        pMVar5 = (this->matchDefs_).
                 super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar12 = pMVar5[lVar14].handlerId;
        tos_abi_cxx11_(&local_80,(flow *)(ulong)pMVar5[lVar14].op,(MatchClass)uVar13);
        in_R9._M_p = (this->handlers_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[pMVar5[lVar14].handlerId].first.
                     _M_dataplus._M_p;
        local_58 = lVar14;
        printf(".const match %7zu = handler %zu, op %s, elsePC %lu ; %s\n",lVar14,sVar12,
               local_80._M_dataplus._M_p,pMVar5[lVar14].elsePC);
        uVar13 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_01;
        }
        lVar16 = (long)*(pointer *)
                        ((long)&pMVar5[lVar14].cases.
                                super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                                ._M_impl + 8) -
                 *(long *)&pMVar5[lVar14].cases.
                           super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                           ._M_impl.super__Vector_impl_data;
        if (lVar16 != 0) {
          lVar17 = 0;
          lVar18 = 0;
          do {
            lVar4 = *(long *)&pMVar5[lVar14].cases.
                              super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                              ._M_impl.super__Vector_impl_data;
            printf("                       case %3zu = label %2lu, pc %4lu ; ",lVar18,
                   *(undefined8 *)(lVar4 + lVar17),*(undefined8 *)(lVar4 + 8 + lVar17));
            if (pMVar5[lVar14].op == RegExp) {
              pcVar10 = util::RegExp::c_str((this->regularExpressions_).
                                            super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                            *(long *)(lVar4 + lVar17));
              __format = "/%s/\n";
            }
            else {
              pcVar10 = (this->strings_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[*(long *)(lVar4 + lVar17)].
                        _M_dataplus._M_p;
              __format = "\'%s\'\n";
            }
            printf(__format,pcVar10);
            lVar18 = lVar18 + 1;
            lVar17 = lVar17 + 0x10;
            uVar13 = extraout_RDX_02;
          } while (lVar16 >> 4 != lVar18);
        }
        lVar14 = local_58 + 1;
      } while (lVar14 != local_60);
    }
  }
  ppVar15 = (this->handlers_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (this->handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar6) {
    do {
      pcVar7 = (ppVar15->first)._M_dataplus._M_p;
      program = (ppVar15->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar12 = computeStackSize(program,(long)(ppVar15->second).
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)program >> 3);
      printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",pcVar7,sVar12,
             (long)(ppVar15->second).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ppVar15->second).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
      this_00 = (flow *)(ppVar15->second).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar8 = (ppVar15->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"  ","");
      disassemble(&local_80,this_00,(Instruction *)((long)puVar8 - (long)this_00 >> 3),
                  (size_t)local_50,(string *)this,(ConstantPool *)in_R9._M_p);
      printf("%s",local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar6);
  }
  puts("\n");
  return;
}

Assistant:

void ConstantPool::dump() const {
  printf("; Program\n");

  if (!modules_.empty()) {
    printf("\n; Modules\n");
    for (size_t i = 0, e = modules_.size(); i != e; ++i) {
      if (modules_[i].second.empty())
        printf(".module '%s'\n", modules_[i].first.c_str());
      else
        printf(".module '%s' from '%s'\n", modules_[i].first.c_str(),
               modules_[i].second.c_str());
    }
  }

  if (!nativeFunctionSignatures_.empty()) {
    printf("\n; External Functions\n");
    for (size_t i = 0, e = nativeFunctionSignatures_.size(); i != e; ++i) {
      printf(".extern function %3zu = %-20s\n", i,
             nativeFunctionSignatures_[i].c_str());
    }
  }

  if (!nativeHandlerSignatures_.empty()) {
    printf("\n; External Handlers\n");
    for (size_t i = 0, e = nativeHandlerSignatures_.size(); i != e; ++i) {
      printf(".extern handler %4zu = %-20s\n", i,
             nativeHandlerSignatures_[i].c_str());
    }
  }

  if (!numbers_.empty()) {
    printf("\n; Integer Constants\n");
    for (size_t i = 0, e = numbers_.size(); i != e; ++i) {
      printf(".const integer %5zu = %" PRIi64 "\n", i, (FlowNumber)numbers_[i]);
    }
  }

  if (!strings_.empty()) {
    printf("\n; String Constants\n");
    for (size_t i = 0, e = strings_.size(); i != e; ++i) {
      printf(".const string %6zu = '%s'\n", i, strings_[i].c_str());
    }
  }

  if (!ipaddrs_.empty()) {
    printf("\n; IP Constants\n");
    for (size_t i = 0, e = ipaddrs_.size(); i != e; ++i) {
      printf(".const ipaddr %6zu = %s\n", i, ipaddrs_[i].str().c_str());
    }
  }

  if (!cidrs_.empty()) {
    printf("\n; CIDR Constants\n");
    for (size_t i = 0, e = cidrs_.size(); i != e; ++i) {
      printf(".const cidr %8zu = %s\n", i, cidrs_[i].str().c_str());
    }
  }

  if (!regularExpressions_.empty()) {
    printf("\n; Regular Expression Constants\n");
    for (size_t i = 0, e = regularExpressions_.size(); i != e; ++i) {
      printf(".const regex %7zu = /%s/\n", i, regularExpressions_[i].c_str());
    }
  }

  if (!stringArrays_.empty()) {
    std::cout << "\n; Constant String Arrays\n";
    for (size_t i = 0, e = stringArrays_.size(); i != e; ++i) {
      const std::vector<std::string>& array = stringArrays_[i];
      std::cout << ".const array<string> " << std::setw(3) << i << " = [";
      for (size_t k = 0, m = array.size(); k != m; ++k) {
        if (k) std::cout << ", ";
        std::cout << '"' << array[k] << '"';
      }
      std::cout << "];\n";
    }
  }

  dumpArrays(intArrays_, "Integer");
  dumpArrays(ipaddrArrays_, "IPAddress");
  dumpArrays(cidrArrays_, "Cidr");

  if (!matchDefs_.empty()) { // {{{
    printf("\n; Match Table\n");
    for (size_t i = 0, e = matchDefs_.size(); i != e; ++i) {
      const MatchDef& def = matchDefs_[i];
      printf(".const match %7zu = handler %zu, op %s, elsePC %" PRIu64
             " ; %s\n",
             i, def.handlerId, tos(def.op).c_str(), def.elsePC,
             handlers_[def.handlerId].first.c_str());

      for (size_t k = 0, m = def.cases.size(); k != m; ++k) {
        const MatchCaseDef& one = def.cases[k];

        printf("                       case %3zu = label %2" PRIu64
               ", pc %4" PRIu64 " ; ",
               k, one.label, one.pc);

        if (def.op == MatchClass::RegExp) {
          printf("/%s/\n", regularExpressions_[one.label].c_str());
        } else {
          printf("'%s'\n", strings_[one.label].c_str());
        }
      }
    }
  } // }}}

  for (const auto& handler: getHandlers()) {
    const auto& name = handler.first;
    const auto& code = handler.second;

    printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",
           name.c_str(),
           computeStackSize(code.data(), code.size()),
           code.size());
    printf("%s", disassemble(code.data(), code.size(), "  ", this).c_str());
  }

  printf("\n\n");
}